

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.h
# Opt level: O3

void __thiscall
pbrt::RGBFilm::AddSample
          (RGBFilm *this,Point2i *pFilm,SampledSpectrum L,SampledWavelengths *lambda,
          VisibleSurface *param_4,Float weight)

{
  Float FVar1;
  PixelSensor *this_00;
  Pixel *pPVar2;
  undefined1 auVar3 [16];
  long lVar4;
  int iVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [64];
  undefined1 auVar9 [56];
  undefined1 auVar8 [64];
  undefined1 auVar10 [16];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  float fVar14;
  RGB RVar15;
  SampledSpectrum H;
  SampledSpectrum local_28;
  
  auVar11._8_56_ = L._16_56_;
  auVar11._0_8_ = L.values.values._8_8_;
  auVar7._8_56_ = L._8_56_;
  auVar7._0_8_ = L.values.values._0_8_;
  this_00 = (this->super_FilmBase).sensor;
  auVar3 = vmovlhps_avx(auVar7._0_16_,auVar11._0_16_);
  FVar1 = this_00->imagingRatio;
  auVar13._4_4_ = FVar1;
  auVar13._0_4_ = FVar1;
  auVar13._8_4_ = FVar1;
  auVar13._12_4_ = FVar1;
  local_28.values.values = (array<float,_4>)vmulps_avx512vl(auVar3,auVar13);
  auVar9 = ZEXT856(local_28.values.values._8_8_);
  RVar15 = PixelSensor::ToSensorRGB(this_00,&local_28,lambda);
  auVar12._4_60_ = auVar11._4_60_;
  auVar12._0_4_ = RVar15.b;
  auVar8._0_8_ = RVar15._0_8_;
  auVar8._8_56_ = auVar9;
  auVar6 = auVar8._0_16_;
  auVar13 = vmovshdup_avx(auVar6);
  auVar3 = vmaxss_avx(auVar13,auVar6);
  auVar10 = auVar12._0_16_;
  auVar3 = vmaxss_avx(auVar10,auVar3);
  if (this->maxComponentValue < auVar3._0_4_) {
    fVar14 = this->maxComponentValue / auVar3._0_4_;
    auVar6 = ZEXT416((uint)(RVar15.r * fVar14));
    auVar13 = ZEXT416((uint)(auVar13._0_4_ * fVar14));
    auVar10 = ZEXT416((uint)(auVar12._0_4_ * fVar14));
  }
  iVar5 = (this->pixels).extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
  lVar4 = 0;
  iVar5 = ((this->pixels).extent.pMax.super_Tuple2<pbrt::Point2,_int>.x - iVar5) *
          ((pFilm->super_Tuple2<pbrt::Point2,_int>).y -
          (this->pixels).extent.pMin.super_Tuple2<pbrt::Point2,_int>.y) +
          ((pFilm->super_Tuple2<pbrt::Point2,_int>).x - iVar5);
  pPVar2 = (this->pixels).values;
  do {
    fVar14 = auVar6._0_4_;
    if (((int)lVar4 != 0) && (fVar14 = auVar13._0_4_, (int)lVar4 != 1)) {
      fVar14 = auVar10._0_4_;
    }
    pPVar2[iVar5].rgbSum[lVar4] = (double)(fVar14 * weight) + pPVar2[iVar5].rgbSum[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  pPVar2[iVar5].weightSum = (double)weight + pPVar2[iVar5].weightSum;
  return;
}

Assistant:

PBRT_CPU_GPU
    void AddSample(const Point2i &pFilm, SampledSpectrum L,
                   const SampledWavelengths &lambda, const VisibleSurface *,
                   Float weight) {
        // Convert sample radiance to _PixelSensor_ RGB
        SampledSpectrum H = L * sensor->ImagingRatio();
        RGB rgb = sensor->ToSensorRGB(H, lambda);

        // Optionally clamp sensor RGB value
        Float m = std::max({rgb.r, rgb.g, rgb.b});
        if (m > maxComponentValue) {
            H *= maxComponentValue / m;
            rgb *= maxComponentValue / m;
        }

        DCHECK(InsideExclusive(pFilm, pixelBounds));
        // Update pixel values with filtered sample contribution
        Pixel &pixel = pixels[pFilm];
        for (int c = 0; c < 3; ++c)
            pixel.rgbSum[c] += weight * rgb[c];
        pixel.weightSum += weight;
    }